

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O1

void Js::AsmJsByteCodeDumper::
     DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data
               ,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  uint32 uVar6;
  int iVar7;
  void *pvVar8;
  WasmFunctionInfo *pWVar9;
  undefined4 extraout_var;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar7 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar7 < 0x141) {
    if (iVar7 < 0xed) {
      switch(iVar7) {
      case 0x4d:
      case 0x4e:
        pvVar8 = FunctionProxy::GetAuxPtr((FunctionProxy *)dumpFunction,AsmJsFunctionInfo);
        lVar3 = *(long *)((long)pvVar8 + 0x90);
        if ((lVar3 != 0) &&
           (uVar1 = data->SlotIndex,
           uVar2 = (*(WebAssemblyModule **)(lVar3 + 8))->m_importedFunctionCount,
           uVar6 = WebAssemblyModule::GetWasmFunctionCount(*(WebAssemblyModule **)(lVar3 + 8)),
           ~uVar2 + (uint)uVar1 < uVar6)) {
          pWVar9 = WebAssemblyModule::GetWasmFunctionInfo
                             (*(WebAssemblyModule **)(lVar3 + 8),
                              ~(*(WebAssemblyModule **)(lVar3 + 8))->m_importedFunctionCount +
                              (uint)data->SlotIndex);
          uVar1 = data->Value;
          iVar7 = (*(((pWVar9->m_body).ptr)->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          Output::Print(L" R%d = %s",(ulong)uVar1,CONCAT44(extraout_var,iVar7));
          return;
        }
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" R%d = R%d[%d]";
        break;
      case 0x4f:
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" D%d = R%d[%d]";
        break;
      case 0x50:
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" I%d = R%d[%d]";
        break;
      case 0x51:
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" L%d = R%d[%d]";
        break;
      case 0x52:
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" F%d = R%d[%d]";
        break;
      case 0x53:
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        uVar11 = (ulong)data->Value;
        form = L" R%d[%d] = D%d";
        break;
      case 0x54:
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        uVar11 = (ulong)data->Value;
        form = L" R%d[%d] = I%d";
        break;
      case 0x55:
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        uVar11 = (ulong)data->Value;
        form = L" R%d[%d] = L%d";
        break;
      case 0x56:
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        uVar11 = (ulong)data->Value;
        form = L" R%d[%d] = F%d";
        break;
      case 0x57:
      case 0x58:
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" R%d = R%d[I%d]";
        break;
      default:
switchD_007e1141_default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                    ,0x1fe,"(false)","Unknown OpCode for OpLayoutElementSlot");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
        return;
      }
    }
    else if (iVar7 < 0xf3) {
      if (iVar7 == 0xed) {
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" I4_%d = R%d[%d]";
      }
      else {
        if (iVar7 != 0xee) goto switchD_007e1141_default;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        uVar11 = (ulong)data->Value;
        form = L" R%d[%d]  = I4_%d";
      }
    }
    else if (iVar7 == 0xf3) {
      uVar13 = (ulong)data->Value;
      uVar12 = (ulong)data->Instance;
      uVar11 = (ulong)data->SlotIndex;
      form = L" I8_%d = R%d[%d]";
    }
    else {
      if (iVar7 != 0xf7) goto switchD_007e1141_default;
      uVar13 = (ulong)data->Value;
      uVar12 = (ulong)data->Instance;
      uVar11 = (ulong)data->SlotIndex;
      form = L" I16_%d = R%d[%d]";
    }
  }
  else if (iVar7 < 0x1e5) {
    switch(iVar7) {
    case 0x18c:
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      uVar11 = (ulong)data->Value;
      form = L" R%d[%d]  = I8_%d";
      break;
    case 0x18d:
      uVar13 = (ulong)data->Value;
      uVar12 = (ulong)data->Instance;
      uVar11 = (ulong)data->SlotIndex;
      form = L" U4_%d = R%d[%d]";
      break;
    case 0x18e:
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      uVar11 = (ulong)data->Value;
      form = L" R%d[%d]  = U4_%d";
      break;
    case 399:
      uVar13 = (ulong)data->Value;
      uVar12 = (ulong)data->Instance;
      uVar11 = (ulong)data->SlotIndex;
      form = L" U8_%d = R%d[%d]";
      break;
    case 400:
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      uVar11 = (ulong)data->Value;
      form = L" R%d[%d]  = U8_%d";
      break;
    case 0x191:
      uVar13 = (ulong)data->Value;
      uVar12 = (ulong)data->Instance;
      uVar11 = (ulong)data->SlotIndex;
      form = L" U16_%d = R%d[%d]";
      break;
    case 0x192:
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      uVar11 = (ulong)data->Value;
      form = L" R%d[%d]  = U16_%d";
      break;
    default:
      if (iVar7 == 0x141) {
        uVar13 = (ulong)data->Value;
        uVar12 = (ulong)data->Instance;
        uVar11 = (ulong)data->SlotIndex;
        form = L" F4_%d = R%d[%d]";
      }
      else {
        if (iVar7 != 0x142) goto switchD_007e1141_default;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        uVar11 = (ulong)data->Value;
        form = L" R%d[%d]  = F4_%d";
      }
    }
  }
  else if (iVar7 < 0x266) {
    if (iVar7 == 0x1e5) {
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      uVar11 = (ulong)data->Value;
      form = L" R%d[%d]  = I16_%d";
    }
    else if (iVar7 == 0x259) {
      uVar13 = (ulong)data->Value;
      uVar12 = (ulong)data->Instance;
      uVar11 = (ulong)data->SlotIndex;
      form = L" B4_%d = R%d[%d]";
    }
    else {
      if (iVar7 != 0x25a) goto switchD_007e1141_default;
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      uVar11 = (ulong)data->Value;
      form = L" R%d[%d]  = B4_%d";
    }
  }
  else if (iVar7 < 0x26f) {
    if (iVar7 == 0x266) {
      uVar13 = (ulong)data->Value;
      uVar12 = (ulong)data->Instance;
      uVar11 = (ulong)data->SlotIndex;
      form = L" B8_%d = R%d[%d]";
    }
    else {
      if (iVar7 != 0x267) goto switchD_007e1141_default;
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      uVar11 = (ulong)data->Value;
      form = L" R%d[%d]  = B8_%d";
    }
  }
  else if (iVar7 == 0x26f) {
    uVar13 = (ulong)data->Value;
    uVar12 = (ulong)data->Instance;
    uVar11 = (ulong)data->SlotIndex;
    form = L" B16_%d = R%d[%d]";
  }
  else {
    if (iVar7 != 0x270) goto switchD_007e1141_default;
    uVar13 = (ulong)data->Instance;
    uVar12 = (ulong)data->SlotIndex;
    uVar11 = (ulong)data->Value;
    form = L" R%d[%d]  = B16_%d";
  }
  Output::Print(form,uVar13,uVar12,uVar11);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpElementSlot(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
        case OpCodeAsmJs::LdSlot:
        case OpCodeAsmJs::LdSlotArr:
        {
#ifdef ENABLE_WASM
            auto asmInfo = dumpFunction->GetAsmJsFunctionInfo();
            auto wasmInfo = asmInfo->GetWasmReaderInfo();
            if (wasmInfo)
            {
                uint index = (uint)data->SlotIndex;
                if (index - wasmInfo->m_module->GetFuncOffset() < wasmInfo->m_module->GetWasmFunctionCount())
                {
                    uint funcIndex = data->SlotIndex - wasmInfo->m_module->GetFuncOffset();
                    auto loadedFunc = wasmInfo->m_module->GetWasmFunctionInfo(funcIndex);
                    Output::Print(_u(" R%d = %s"), data->Value, loadedFunc->GetBody()->GetDisplayName());
                    break;
                }
            }
#endif
            Output::Print(_u(" R%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        }
        case OpCodeAsmJs::LdArr_Func:
        case OpCodeAsmJs::LdArr_WasmFunc:
            Output::Print(_u(" R%d = R%d[I%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::StSlot_Int:
            Output::Print(_u(" R%d[%d] = I%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Long:
            Output::Print(_u(" R%d[%d] = L%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Flt:
            Output::Print(_u(" R%d[%d] = F%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Db:
            Output::Print(_u(" R%d[%d] = D%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::LdSlot_Int:
            Output::Print(_u(" I%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Long:
            Output::Print(_u(" L%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Flt:
            Output::Print(_u(" F%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Db:
            Output::Print(_u(" D%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_F4:
            Output::Print(_u(" F4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I4:
            Output::Print(_u(" I4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I8:
            Output::Print(_u(" I8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I16:
            Output::Print(_u(" I16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U4:
            Output::Print(_u(" U4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U8:
            Output::Print(_u(" U8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U16:
            Output::Print(_u(" U16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B4:
            Output::Print(_u(" B4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B8:
            Output::Print(_u(" B8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B16:
            Output::Print(_u(" B16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
#if 0
        case OpCodeAsmJs::Simd128_LdSlot_D2:
            Output::Print(_u(" D2_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;

#endif // 0

        case OpCodeAsmJs::Simd128_StSlot_F4:
            Output::Print(_u(" R%d[%d]  = F4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I4:
            Output::Print(_u(" R%d[%d]  = I4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I8:
            Output::Print(_u(" R%d[%d]  = I8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I16:
            Output::Print(_u(" R%d[%d]  = I16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U4:
            Output::Print(_u(" R%d[%d]  = U4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U8:
            Output::Print(_u(" R%d[%d]  = U8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U16:
            Output::Print(_u(" R%d[%d]  = U16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B4:
            Output::Print(_u(" R%d[%d]  = B4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B8:
            Output::Print(_u(" R%d[%d]  = B8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B16:
            Output::Print(_u(" R%d[%d]  = B16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
#if 0
        case OpCodeAsmJs::Simd128_StSlot_D2:
            Output::Print(_u(" R%d[%d]  = D2_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
#endif // 0

        default:
        {
            AssertMsg(false, "Unknown OpCode for OpLayoutElementSlot");
            break;
        }
        }
    }